

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O3

void icu_63::Format::syntaxError(UnicodeString *pattern,int32_t pos,UParseError *parseError)

{
  short sVar1;
  int iVar2;
  int iVar3;
  
  parseError->offset = pos;
  iVar2 = pos + -0xf;
  if (pos < 0x10) {
    iVar2 = 0;
  }
  parseError->line = 0;
  UnicodeString::doExtract(pattern,iVar2,pos - iVar2,parseError->preContext,0);
  parseError->preContext[pos - iVar2] = L'\0';
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (pattern->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  iVar3 = pos + 0xf;
  if (iVar2 < pos + 0x10) {
    iVar3 = iVar2;
  }
  iVar3 = iVar3 - (pos + 1);
  UnicodeString::doExtract(pattern,pos + 1,iVar3,parseError->postContext,0);
  parseError->postContext[iVar3] = L'\0';
  return;
}

Assistant:

void Format::syntaxError(const UnicodeString& pattern,
                         int32_t pos,
                         UParseError& parseError) {
    parseError.offset = pos;
    parseError.line=0;  // we are not using line number

    // for pre-context
    int32_t start = (pos < U_PARSE_CONTEXT_LEN)? 0 : (pos - (U_PARSE_CONTEXT_LEN-1
                                                             /* subtract 1 so that we have room for null*/));
    int32_t stop  = pos;
    pattern.extract(start,stop-start,parseError.preContext,0);
    //null terminate the buffer
    parseError.preContext[stop-start] = 0;

    //for post-context
    start = pos+1;
    stop  = ((pos+U_PARSE_CONTEXT_LEN)<=pattern.length()) ? (pos+(U_PARSE_CONTEXT_LEN-1)) :
        pattern.length();
    pattern.extract(start,stop-start,parseError.postContext,0);
    //null terminate the buffer
    parseError.postContext[stop-start]= 0;
}